

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<kj::Promise<void>,_kj::Own<kj::AsyncIoStream>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:66:11),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Promise<void>,_kj::Own<kj::AsyncIoStream>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:66:11),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::Own<kj::AsyncIoStream>_> depResult;
  Exception local_5b8;
  ExceptionOr<kj::Own<kj::AsyncIoStream>_> local_460;
  ExceptionOr<kj::Promise<void>_> local_2f0;
  Exception local_178;
  
  local_460.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_460.value.ptr.disposer = (Disposer *)0x0;
  local_460.value.ptr.ptr = (AsyncIoStream *)0x0;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&local_460.super_ExceptionOrValue);
  if (local_460.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::Exception(&local_178,&local_460.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_5b8.ownFile.content.ptr = local_178.ownFile.content.ptr;
    local_5b8.ownFile.content.size_ = local_178.ownFile.content.size_;
    local_5b8.ownFile.content.disposer = local_178.ownFile.content.disposer;
    local_178.ownFile.content.ptr = (char *)0x0;
    local_178.ownFile.content.size_ = 0;
    local_5b8.file = local_178.file;
    local_5b8.line = local_178.line;
    local_5b8.type = local_178.type;
    local_5b8.description.content.ptr = local_178.description.content.ptr;
    local_5b8.description.content.size_ = local_178.description.content.size_;
    local_178.description.content.ptr = (char *)0x0;
    local_178.description.content.size_ = 0;
    local_5b8.description.content.disposer = local_178.description.content.disposer;
    local_5b8.context.ptr.disposer = local_178.context.ptr.disposer;
    local_5b8.context.ptr.ptr = local_178.context.ptr.ptr;
    local_178.context.ptr.ptr = (Context *)0x0;
    memcpy(local_5b8.trace,local_178.trace,0x104);
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_2f0,&local_5b8);
    local_2f0.value.ptr.isSet = false;
    Exception::~Exception(&local_5b8);
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_2f0)
    ;
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_2f0);
    Exception::~Exception(&local_178);
  }
  else if (local_460.value.ptr.ptr != (AsyncIoStream *)0x0) {
    anon_class_8_1_5036e509_for_func::operator()
              ((anon_class_8_1_5036e509_for_func *)&local_5b8,(Own<kj::AsyncIoStream> *)&this->func)
    ;
    local_2f0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_2f0.value.ptr.isSet = true;
    local_2f0.value.ptr.field_1.value.super_PromiseBase.node.disposer =
         (Disposer *)local_5b8.ownFile.content.ptr;
    local_2f0.value.ptr.field_1.value.super_PromiseBase.node.ptr =
         (PromiseNode *)local_5b8.ownFile.content.size_;
    local_5b8.ownFile.content.size_ = 0;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_2f0)
    ;
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_2f0);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_5b8);
  }
  ExceptionOr<kj::Own<kj::AsyncIoStream>_>::~ExceptionOr(&local_460);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }